

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_serializer.cc
# Opt level: O3

void __thiscall
prometheus::TextSerializer::Serialize
          (TextSerializer *this,ostream *out,
          vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *metrics)

{
  pointer pBVar1;
  pointer pLVar2;
  pointer pQVar3;
  pointer pCVar4;
  ostream *poVar5;
  ostream *poVar6;
  size_t sVar7;
  double *extraLabelValue;
  pointer pBVar8;
  pointer extraLabelValue_00;
  pointer pMVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  char *pcVar11;
  undefined8 uVar12;
  Label *lp;
  pointer pLVar13;
  ClientMetric *metric;
  pointer pCVar14;
  locale saved_locale;
  string local_d0;
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  pointer local_70;
  pointer local_68;
  locale local_60 [8];
  undefined8 local_58;
  pointer local_50;
  pointer local_48;
  locale local_40 [8];
  locale local_38 [8];
  
  std::locale::locale(local_60,(locale *)(out + *(long *)(*(long *)out + -0x18) + 0xd0));
  uVar12 = *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 8);
  std::locale::classic();
  std::ios::imbue(local_38);
  std::locale::~locale(local_38);
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 8) = 0x10;
  pMVar9 = (metrics->
           super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>).
           _M_impl.super__Vector_impl_data._M_start;
  local_50 = (metrics->
             super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar9 != local_50) {
    do {
      local_58 = uVar12;
      poVar6 = (ostream *)(local_b0 + 0x10);
      paVar10 = &local_90.field_2;
      if ((pMVar9->help)._M_string_length != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(out,"# HELP ",7);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,(pMVar9->name)._M_dataplus._M_p,(pMVar9->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(pMVar9->help)._M_dataplus._M_p,(pMVar9->help)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      }
      switch(pMVar9->type) {
      case Counter:
        local_70 = pMVar9;
        std::__ostream_insert<char,std::char_traits<char>>(out,"# TYPE ",7);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,(pMVar9->name)._M_dataplus._M_p,(pMVar9->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," counter\n",9);
        pCVar4 = (pMVar9->metric).
                 super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pCVar14 = (pMVar9->metric).
                       super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                       ._M_impl.super__Vector_impl_data._M_start; pCVar14 != pCVar4;
            pCVar14 = pCVar14 + 1) {
          local_b0._8_8_ = 0;
          local_a0._M_local_buf[0] = '\0';
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          local_d0._M_string_length = 0;
          local_d0.field_2._M_allocated_capacity =
               local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_90._M_string_length = 0;
          local_90.field_2._M_allocated_capacity._0_2_ =
               local_90.field_2._M_allocated_capacity._0_2_ & 0xff00;
          local_b0._0_8_ = poVar6;
          local_90._M_dataplus._M_p = (pointer)paVar10;
          (anonymous_namespace)::WriteHead<std::__cxx11::string>
                    ((_anonymous_namespace_ *)out,(ostream *)(pMVar9->name)._M_dataplus._M_p,
                     (MetricFamily *)(pMVar9->name)._M_string_length,pCVar14,(string *)local_b0,
                     &local_d0,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar10) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if ((ostream *)local_b0._0_8_ != poVar6) {
            operator_delete((void *)local_b0._0_8_);
          }
          anon_unknown_3::WriteValue(out,(pCVar14->counter).value);
          anon_unknown_3::WriteTail(out,pCVar14);
        }
        break;
      case Gauge:
        local_70 = pMVar9;
        std::__ostream_insert<char,std::char_traits<char>>(out,"# TYPE ",7);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,(pMVar9->name)._M_dataplus._M_p,(pMVar9->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," gauge\n",7);
        pCVar4 = (pMVar9->metric).
                 super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pCVar14 = (pMVar9->metric).
                       super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                       ._M_impl.super__Vector_impl_data._M_start; pCVar14 != pCVar4;
            pCVar14 = pCVar14 + 1) {
          local_b0._8_8_ = 0;
          local_a0._M_local_buf[0] = '\0';
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          local_d0._M_string_length = 0;
          local_d0.field_2._M_allocated_capacity =
               local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_90._M_string_length = 0;
          local_90.field_2._M_allocated_capacity._0_2_ =
               local_90.field_2._M_allocated_capacity._0_2_ & 0xff00;
          local_b0._0_8_ = poVar6;
          local_90._M_dataplus._M_p = (pointer)paVar10;
          (anonymous_namespace)::WriteHead<std::__cxx11::string>
                    ((_anonymous_namespace_ *)out,(ostream *)(pMVar9->name)._M_dataplus._M_p,
                     (MetricFamily *)(pMVar9->name)._M_string_length,pCVar14,(string *)local_b0,
                     &local_d0,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar10) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if ((ostream *)local_b0._0_8_ != poVar6) {
            operator_delete((void *)local_b0._0_8_);
          }
          anon_unknown_3::WriteValue(out,(pCVar14->gauge).value);
          anon_unknown_3::WriteTail(out,pCVar14);
        }
        break;
      case Summary:
        local_70 = pMVar9;
        std::__ostream_insert<char,std::char_traits<char>>(out,"# TYPE ",7);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,(pMVar9->name)._M_dataplus._M_p,(pMVar9->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," summary\n",9);
        pCVar14 = (pMVar9->metric).
                  super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_68 = (pMVar9->metric).
                   super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if (pCVar14 != local_68) {
          do {
            poVar6 = (ostream *)(local_b0 + 0x10);
            local_a0._M_local_buf[4] = 'n';
            local_a0._M_local_buf[5] = 't';
            local_a0._M_local_buf[0] = '_';
            local_a0._M_allocated_capacity._1_2_ = 0x6f63;
            local_a0._M_local_buf[3] = 'u';
            local_b0._8_8_ = 6;
            local_a0._M_local_buf[6] = '\0';
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            local_d0._M_string_length = 0;
            local_d0.field_2._M_allocated_capacity =
                 local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_90._M_string_length = 0;
            local_90.field_2._M_allocated_capacity._0_2_ =
                 local_90.field_2._M_allocated_capacity._0_2_ & 0xff00;
            local_b0._0_8_ = poVar6;
            local_90._M_dataplus._M_p = (pointer)paVar10;
            (anonymous_namespace)::WriteHead<std::__cxx11::string>
                      ((_anonymous_namespace_ *)out,(ostream *)(pMVar9->name)._M_dataplus._M_p,
                       (MetricFamily *)(pMVar9->name)._M_string_length,pCVar14,(string *)local_b0,
                       &local_d0,&local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != paVar10) {
              operator_delete(local_90._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
            if ((ostream *)local_b0._0_8_ != poVar6) {
              operator_delete((void *)local_b0._0_8_);
            }
            std::ostream::_M_insert<unsigned_long>((ulong)out);
            anon_unknown_3::WriteTail(out,pCVar14);
            local_a0._M_local_buf[0] = '_';
            local_a0._M_allocated_capacity._1_2_ = 0x7573;
            local_a0._M_local_buf[3] = 'm';
            local_b0._8_8_ = 4;
            local_a0._M_local_buf[4] = '\0';
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            local_d0._M_string_length = 0;
            local_d0.field_2._M_allocated_capacity =
                 local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_90._M_string_length = 0;
            local_90.field_2._M_allocated_capacity._0_2_ =
                 local_90.field_2._M_allocated_capacity._0_2_ & 0xff00;
            local_b0._0_8_ = poVar6;
            local_90._M_dataplus._M_p = (pointer)paVar10;
            (anonymous_namespace)::WriteHead<std::__cxx11::string>
                      ((_anonymous_namespace_ *)out,(ostream *)(pMVar9->name)._M_dataplus._M_p,
                       (MetricFamily *)(pMVar9->name)._M_string_length,pCVar14,(string *)local_b0,
                       &local_d0,&local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != paVar10) {
              operator_delete(local_90._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
            if ((ostream *)local_b0._0_8_ != poVar6) {
              operator_delete((void *)local_b0._0_8_);
            }
            anon_unknown_3::WriteValue(out,(pCVar14->summary).sample_sum);
            anon_unknown_3::WriteTail(out,pCVar14);
            pQVar3 = (pCVar14->summary).quantile.
                     super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (extraLabelValue_00 =
                      (pCVar14->summary).quantile.
                      super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
                      ._M_impl.super__Vector_impl_data._M_start; extraLabelValue_00 != pQVar3;
                extraLabelValue_00 = extraLabelValue_00 + 1) {
              local_b0._0_8_ = local_b0 + 0x10;
              local_b0._8_8_ = 0;
              local_a0._M_local_buf[0] = '\0';
              local_d0.field_2._M_allocated_capacity = 0x656c69746e617571;
              local_d0._M_string_length = 8;
              local_d0.field_2._M_local_buf[8] = '\0';
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              anon_unknown_3::WriteHead<double>
                        ((anon_unknown_3 *)out,(ostream *)(local_70->name)._M_dataplus._M_p,
                         (MetricFamily *)(local_70->name)._M_string_length,pCVar14,
                         (string *)local_b0,&local_d0,&extraLabelValue_00->quantile);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                operator_delete(local_d0._M_dataplus._M_p);
              }
              if ((ostream *)local_b0._0_8_ != (ostream *)(local_b0 + 0x10)) {
                operator_delete((void *)local_b0._0_8_);
              }
              anon_unknown_3::WriteValue(out,extraLabelValue_00->value);
              anon_unknown_3::WriteTail(out,pCVar14);
            }
            pCVar14 = pCVar14 + 1;
            pMVar9 = local_70;
          } while (pCVar14 != local_68);
        }
        break;
      case Untyped:
        local_70 = pMVar9;
        std::__ostream_insert<char,std::char_traits<char>>(out,"# TYPE ",7);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,(pMVar9->name)._M_dataplus._M_p,(pMVar9->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," untyped\n",9);
        pCVar4 = (pMVar9->metric).
                 super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pCVar14 = (pMVar9->metric).
                       super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                       ._M_impl.super__Vector_impl_data._M_start; pCVar14 != pCVar4;
            pCVar14 = pCVar14 + 1) {
          local_b0._8_8_ = 0;
          local_a0._M_local_buf[0] = '\0';
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          local_d0._M_string_length = 0;
          local_d0.field_2._M_allocated_capacity =
               local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_90._M_string_length = 0;
          local_90.field_2._M_allocated_capacity._0_2_ =
               local_90.field_2._M_allocated_capacity._0_2_ & 0xff00;
          local_b0._0_8_ = poVar6;
          local_90._M_dataplus._M_p = (pointer)paVar10;
          (anonymous_namespace)::WriteHead<std::__cxx11::string>
                    ((_anonymous_namespace_ *)out,(ostream *)(pMVar9->name)._M_dataplus._M_p,
                     (MetricFamily *)(pMVar9->name)._M_string_length,pCVar14,(string *)local_b0,
                     &local_d0,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar10) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if ((ostream *)local_b0._0_8_ != poVar6) {
            operator_delete((void *)local_b0._0_8_);
          }
          anon_unknown_3::WriteValue(out,(pCVar14->untyped).value);
          anon_unknown_3::WriteTail(out,pCVar14);
        }
        break;
      case Histogram:
        local_70 = pMVar9;
        std::__ostream_insert<char,std::char_traits<char>>(out,"# TYPE ",7);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,(pMVar9->name)._M_dataplus._M_p,(pMVar9->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," histogram\n",0xb);
        pCVar14 = (pMVar9->metric).
                  super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_48 = (pMVar9->metric).
                   super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if (pCVar14 != local_48) {
          do {
            poVar6 = (ostream *)(local_b0 + 0x10);
            paVar10 = &local_90.field_2;
            local_a0._M_local_buf[4] = 'n';
            local_a0._M_local_buf[5] = 't';
            local_a0._M_local_buf[0] = '_';
            local_a0._M_allocated_capacity._1_2_ = 0x6f63;
            local_a0._M_local_buf[3] = 'u';
            local_b0._8_8_ = 6;
            local_a0._M_local_buf[6] = '\0';
            local_d0._M_string_length = 0;
            local_d0.field_2._M_allocated_capacity =
                 local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_90._M_string_length = 0;
            local_90.field_2._M_allocated_capacity._0_2_ =
                 local_90.field_2._M_allocated_capacity._0_2_ & 0xff00;
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            local_b0._0_8_ = poVar6;
            local_90._M_dataplus._M_p = (pointer)paVar10;
            (anonymous_namespace)::WriteHead<std::__cxx11::string>
                      ((_anonymous_namespace_ *)out,(ostream *)(pMVar9->name)._M_dataplus._M_p,
                       (MetricFamily *)(pMVar9->name)._M_string_length,pCVar14,(string *)local_b0,
                       &local_d0,&local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != paVar10) {
              operator_delete(local_90._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
            if ((ostream *)local_b0._0_8_ != poVar6) {
              operator_delete((void *)local_b0._0_8_);
            }
            std::ostream::_M_insert<unsigned_long>((ulong)out);
            anon_unknown_3::WriteTail(out,pCVar14);
            local_a0._M_local_buf[0] = '_';
            local_a0._M_allocated_capacity._1_2_ = 0x7573;
            local_a0._M_local_buf[3] = 'm';
            local_b0._8_8_ = 4;
            local_a0._M_local_buf[4] = '\0';
            local_d0._M_string_length = 0;
            local_d0.field_2._M_allocated_capacity =
                 local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_90._M_string_length = 0;
            local_90.field_2._M_allocated_capacity._0_2_ =
                 local_90.field_2._M_allocated_capacity._0_2_ & 0xff00;
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            local_b0._0_8_ = poVar6;
            local_90._M_dataplus._M_p = (pointer)paVar10;
            (anonymous_namespace)::WriteHead<std::__cxx11::string>
                      ((_anonymous_namespace_ *)out,(ostream *)(local_70->name)._M_dataplus._M_p,
                       (MetricFamily *)(local_70->name)._M_string_length,pCVar14,(string *)local_b0,
                       &local_d0,&local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != paVar10) {
              operator_delete(local_90._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
            if ((ostream *)local_b0._0_8_ != poVar6) {
              operator_delete((void *)local_b0._0_8_);
            }
            anon_unknown_3::WriteValue(out,(pCVar14->histogram).sample_sum);
            anon_unknown_3::WriteTail(out,pCVar14);
            pBVar8 = (pCVar14->histogram).bucket.
                     super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pBVar1 = (pCVar14->histogram).bucket.
                     super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (pBVar8 == pBVar1) {
LAB_00128308:
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              local_d0.field_2._M_allocated_capacity = 0x74656b6375625f;
              local_d0._M_string_length = 7;
              local_90.field_2._M_allocated_capacity._0_2_ = 0x656c;
              local_90._M_string_length = 2;
              local_90.field_2._M_local_buf[2] = '\0';
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 (out,(local_70->name)._M_dataplus._M_p,
                                  (local_70->name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar6,local_d0._M_dataplus._M_p,local_d0._M_string_length);
              if (((pCVar14->label).
                   super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                   ._M_impl.super__Vector_impl_data._M_start !=
                   (pCVar14->label).
                   super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                   ._M_impl.super__Vector_impl_data._M_finish) || (local_90._M_string_length != 0))
              {
                std::__ostream_insert<char,std::char_traits<char>>(out,"{",1);
                pLVar13 = (pCVar14->label).
                          super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pLVar2 = (pCVar14->label).
                         super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                pcVar11 = "";
                if (pLVar13 != pLVar2) {
                  pcVar11 = "";
                  do {
                    sVar7 = strlen(pcVar11);
                    std::__ostream_insert<char,std::char_traits<char>>(out,pcVar11,sVar7);
                    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                       (out,(pLVar13->name)._M_dataplus._M_p,
                                        (pLVar13->name)._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"=\"",2);
                    anon_unknown_3::WriteValue
                              ((anon_unknown_3 *)out,(ostream *)(pLVar13->value)._M_dataplus._M_p,
                               (string *)(pLVar13->value)._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(out,"\"",1);
                    pLVar13 = pLVar13 + 1;
                    pcVar11 = ",";
                  } while (pLVar13 != pLVar2);
                  pcVar11 = ",";
                }
                poVar6 = (ostream *)(local_b0 + 0x10);
                if (local_90._M_string_length != 0) {
                  sVar7 = strlen(pcVar11);
                  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar11,sVar7);
                  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                     (out,local_90._M_dataplus._M_p,local_90._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"=\"",2);
                  local_a0._M_local_buf[0] = '+';
                  local_a0._M_allocated_capacity._1_2_ = 0x6e49;
                  local_a0._M_local_buf[3] = 'f';
                  local_b0._8_8_ = 4;
                  local_a0._M_local_buf[4] = '\0';
                  local_b0._0_8_ = poVar6;
                  anon_unknown_3::WriteValue((anon_unknown_3 *)out,poVar6,(string *)0x4);
                  if ((ostream *)local_b0._0_8_ != poVar6) {
                    operator_delete((void *)local_b0._0_8_);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>(out,"\"",1);
                }
                std::__ostream_insert<char,std::char_traits<char>>(out,"}",1);
              }
              std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                operator_delete(local_d0._M_dataplus._M_p);
              }
              std::ostream::_M_insert<unsigned_long>((ulong)out);
              anon_unknown_3::WriteTail(out,pCVar14);
            }
            else {
              extraLabelValue = &pBVar8->upper_bound;
              do {
                local_a0._M_local_buf[4] = 'k';
                local_a0._M_local_buf[5] = 'e';
                local_a0._M_local_buf[6] = 't';
                local_a0._M_local_buf[0] = '_';
                local_a0._M_allocated_capacity._1_2_ = 0x7562;
                local_a0._M_local_buf[3] = 'c';
                local_b0._8_8_ = 7;
                local_a0._M_local_buf[7] = '\0';
                local_d0._M_string_length = 2;
                local_d0.field_2._M_allocated_capacity._0_3_ = 0x656c;
                local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
                local_b0._0_8_ = poVar6;
                anon_unknown_3::WriteHead<double>
                          ((anon_unknown_3 *)out,(ostream *)(local_70->name)._M_dataplus._M_p,
                           (MetricFamily *)(local_70->name)._M_string_length,pCVar14,
                           (string *)local_b0,&local_d0,extraLabelValue);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                  operator_delete(local_d0._M_dataplus._M_p);
                }
                if ((ostream *)local_b0._0_8_ != poVar6) {
                  operator_delete((void *)local_b0._0_8_);
                }
                local_68 = (pointer)*extraLabelValue;
                std::ostream::_M_insert<unsigned_long>((ulong)out);
                anon_unknown_3::WriteTail(out,pCVar14);
                pBVar8 = (pointer)(extraLabelValue + 1);
                extraLabelValue = extraLabelValue + 2;
              } while (pBVar8 != pBVar1);
              if ((double)local_68 < INFINITY) goto LAB_00128308;
            }
            pCVar14 = pCVar14 + 1;
            pMVar9 = local_70;
          } while (pCVar14 != local_48);
        }
        break;
      case Info:
        local_70 = pMVar9;
        std::__ostream_insert<char,std::char_traits<char>>(out,"# TYPE ",7);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,(pMVar9->name)._M_dataplus._M_p,(pMVar9->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," gauge\n",7);
        pCVar4 = (pMVar9->metric).
                 super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pCVar14 = (pMVar9->metric).
                       super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                       ._M_impl.super__Vector_impl_data._M_start; pCVar14 != pCVar4;
            pCVar14 = pCVar14 + 1) {
          local_a0._M_local_buf[4] = 'o';
          local_a0._M_local_buf[0] = '_';
          local_a0._M_allocated_capacity._1_2_ = 0x6e69;
          local_a0._M_local_buf[3] = 'f';
          local_b0._8_8_ = 5;
          local_a0._M_local_buf[5] = '\0';
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          local_d0._M_string_length = 0;
          local_d0.field_2._M_allocated_capacity =
               local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_90._M_string_length = 0;
          local_90.field_2._M_allocated_capacity._0_2_ =
               local_90.field_2._M_allocated_capacity._0_2_ & 0xff00;
          local_b0._0_8_ = poVar6;
          local_90._M_dataplus._M_p = (pointer)paVar10;
          (anonymous_namespace)::WriteHead<std::__cxx11::string>
                    ((_anonymous_namespace_ *)out,(ostream *)(pMVar9->name)._M_dataplus._M_p,
                     (MetricFamily *)(pMVar9->name)._M_string_length,pCVar14,(string *)local_b0,
                     &local_d0,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar10) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if ((ostream *)local_b0._0_8_ != poVar6) {
            operator_delete((void *)local_b0._0_8_);
          }
          anon_unknown_3::WriteValue(out,(pCVar14->info).value);
          anon_unknown_3::WriteTail(out,pCVar14);
        }
      }
      pMVar9 = pMVar9 + 1;
      uVar12 = local_58;
    } while (pMVar9 != local_50);
  }
  std::ios::imbue(local_40);
  std::locale::~locale(local_40);
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 8) = uVar12;
  std::locale::~locale(local_60);
  return;
}

Assistant:

void TextSerializer::Serialize(std::ostream& out,
                               const std::vector<MetricFamily>& metrics) const {
  auto saved_locale = out.getloc();
  auto saved_precision = out.precision();

  out.imbue(std::locale::classic());
  out.precision(std::numeric_limits<double>::max_digits10 - 1);

  for (auto& family : metrics) {
    SerializeFamily(out, family);
  }

  out.imbue(saved_locale);
  out.precision(saved_precision);
}